

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgflusher.cc
# Opt level: O0

void bgflusher_shutdown(void)

{
  avl_node *__ptr;
  size_t i;
  openfiles_elem *elem;
  avl_node *a;
  void *ret;
  ulong local_20;
  avl_node *local_10;
  void *local_8;
  
  if (bgflusher_tids != (pthread_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&sync_mutex);
    bgflusher_terminate_signal = '\x01';
    pthread_cond_broadcast((pthread_cond_t *)&sync_cond);
    pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
    for (local_20 = 0; local_20 < num_bgflusher_threads; local_20 = local_20 + 1) {
      pthread_join(bgflusher_tids[local_20],&local_8);
    }
    free(bgflusher_tids);
    bgflusher_tids = (pthread_t *)0x0;
    pthread_mutex_lock((pthread_mutex_t *)&bgf_lock);
    local_10 = avl_first(&openfiles);
    while (local_10 != (avl_node *)0x0) {
      __ptr = local_10 + -0x36;
      local_10 = avl_next(local_10);
      avl_remove((avl_tree *)elem,(avl_node *)i);
      free(__ptr);
    }
    sleep_duration = 2;
    bgflusher_initialized = '\0';
    pthread_mutex_destroy((pthread_mutex_t *)&sync_mutex);
    pthread_cond_destroy((pthread_cond_t *)&sync_cond);
    pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
    pthread_mutex_destroy((pthread_mutex_t *)&bgf_lock);
  }
  return;
}

Assistant:

void bgflusher_shutdown()
{
    void *ret;
    struct avl_node *a = NULL;
    struct openfiles_elem *elem;

    if (!bgflusher_tids) {
        return;
    }

    // set terminate signal
    mutex_lock(&sync_mutex);
    bgflusher_terminate_signal = 1;
    thread_cond_broadcast(&sync_cond);
    mutex_unlock(&sync_mutex);

    for (size_t i = 0; i < num_bgflusher_threads; ++i) {
        thread_join(bgflusher_tids[i], &ret);
    }
    free(bgflusher_tids);
    bgflusher_tids = NULL;

    mutex_lock(&bgf_lock);
    // free all elems in the tree
    a = avl_first(&openfiles);
    while (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        a = avl_next(a);

        avl_remove(&openfiles, &elem->avl);
        free(elem);
    }

    sleep_duration = FDB_BGFLUSHER_SLEEP_DURATION;
    bgflusher_initialized = 0;
    mutex_destroy(&sync_mutex);
    thread_cond_destroy(&sync_cond);
    mutex_unlock(&bgf_lock);

    mutex_destroy(&bgf_lock);
}